

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  byte bVar1;
  Arena *this_00;
  _Base_ptr p_Var2;
  int iVar3;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var4;
  LogMessage *pLVar5;
  _Base_ptr p_Var6;
  undefined4 extraout_var;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar7;
  LogFinisher local_61;
  LogMessage local_60;
  
  local_60.filename_ = (char *)0x0;
  local_60.line_ = 0;
  local_60._20_4_ = 0;
  local_60.message_._M_dataplus._M_p = (pointer)0x0;
  local_60.level_ = number;
  pVar7 = std::
          _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)
                             &local_60);
  _Var4 = pVar7.first._M_node;
  _Var4._M_node[1]._M_right = (_Base_ptr)descriptor;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(char *)((long)&_Var4._M_node[1]._M_left + 1) == '\0') {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2ec);
      pLVar5 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                         );
      LogFinisher::operator=(&local_61,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
    bVar1 = *(byte *)&_Var4._M_node[1]._M_left;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar5 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_61,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2ec);
      pLVar5 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
  }
  else {
    *(FieldType *)&_Var4._M_node[1]._M_left = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar5 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_61,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 10) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2e7);
      pLVar5 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
    *(undefined1 *)((long)&_Var4._M_node[1]._M_left + 1) = 1;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      p_Var6 = (_Base_ptr)operator_new(0x18);
      *(undefined8 *)p_Var6 = 0;
      p_Var6->_M_parent = (_Base_ptr)0x0;
      p_Var6->_M_left = (_Base_ptr)0x0;
    }
    else {
      p_Var6 = (_Base_ptr)
               Arena::AllocateAligned
                         (this_00,(type_info *)
                                  &RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,0x18);
      *(Arena **)p_Var6 = this_00;
      p_Var6->_M_parent = (_Base_ptr)0x0;
      p_Var6->_M_left = (_Base_ptr)0x0;
      Arena::AddListNode(this_00,p_Var6,
                         arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                        );
    }
    _Var4._M_node[1]._M_parent = p_Var6;
  }
  p_Var6 = _Var4._M_node[1]._M_parent;
  p_Var2 = p_Var6->_M_left;
  if (p_Var2 != (_Base_ptr)0x0) {
    iVar3 = *(int *)&p_Var6->_M_parent;
    if (iVar3 < (int)p_Var2->_M_color) {
      *(int *)&p_Var6->_M_parent = iVar3 + 1;
      if ((&p_Var2->_M_parent)[iVar3] != (_Base_ptr)0x0) {
        return (MessageLite *)(&p_Var2->_M_parent)[iVar3];
      }
    }
  }
  iVar3 = (*prototype->_vptr_MessageLite[4])(prototype,this->arena_);
  RepeatedPtrFieldBase::
  AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
            ((RepeatedPtrFieldBase *)_Var4._M_node[1]._M_parent,
             (MessageLite *)CONCAT44(extraout_var,iVar3));
  return (MessageLite *)CONCAT44(extraout_var,iVar3);
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }

  // RepeatedPtrField<MessageLite> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = extension->repeated_message_value
      ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == NULL) {
    result = prototype.New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}